

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atomname_a(iasctx *ctx,void *v,int spos)

{
  int iVar1;
  matches *pmVar2;
  match *pmVar3;
  
  if (((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_NAME)) &&
     (iVar1 = strcmp(ctx->atoms[spos]->str,(char *)v), iVar1 == 0)) {
    pmVar2 = (matches *)calloc(0x10,1);
    pmVar2->mmax = 0x10;
    pmVar3 = (match *)malloc(0xb80);
    pmVar2->m = pmVar3;
    pmVar2->mnum = 1;
    *(undefined8 *)pmVar3 = 0;
    pmVar3->a[0] = 0;
    pmVar3->a[1] = 0;
    pmVar3->m[0] = 0;
    pmVar3->m[1] = 0;
    pmVar3->lpos = spos + 1;
    memset(&pmVar3->field_0x2c,0,0x8c);
    return pmVar2;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomname_a APROTO {
	if (spos == ctx->atomsnum)
		return 0;
	struct litem *li = ctx->atoms[spos];
	if (li->type == LITEM_NAME && !strcmp(li->str, v))
		return alwaysmatches(spos+1);
	else
		return 0;
}